

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

bool __thiscall blc::network::Socket::waitWrite(Socket *this,uint usec)

{
  int iVar1;
  int iVar2;
  timeval timeout;
  fd_set fds;
  timeval local_98;
  fd_set local_88;
  
  local_98.tv_sec = 0;
  local_98.tv_usec = (__suseconds_t)usec;
  local_88.fds_bits[0] = 0;
  local_88.fds_bits[1] = 0;
  local_88.fds_bits[2] = 0;
  local_88.fds_bits[3] = 0;
  local_88.fds_bits[4] = 0;
  local_88.fds_bits[5] = 0;
  local_88.fds_bits[6] = 0;
  local_88.fds_bits[7] = 0;
  local_88.fds_bits[8] = 0;
  local_88.fds_bits[9] = 0;
  local_88.fds_bits[10] = 0;
  local_88.fds_bits[0xb] = 0;
  local_88.fds_bits[0xc] = 0;
  local_88.fds_bits[0xd] = 0;
  local_88.fds_bits[0xe] = 0;
  local_88.fds_bits[0xf] = 0;
  iVar2 = this->_socket;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_88.fds_bits[iVar1 >> 6] =
       local_88.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
  iVar2 = select(iVar2 + 1,(fd_set *)0x0,&local_88,(fd_set *)0x0,&local_98);
  return 0 < iVar2;
}

Assistant:

bool blc::network::Socket::waitWrite(unsigned int usec) const {
	fd_set fds;
	#ifdef __WIN32
		struct timeval timeout = {0, static_cast<int32_t>(usec)};
	#elif __APPLE__
		struct timeval timeout = {0, static_cast<int32_t>(usec)};
	#else
		struct timeval timeout = {0, reinterpret_cast<unsigned int>(usec)};
	#endif

	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, 0, &fds, 0, &timeout) <= 0)
		return (false);
	return (true);
}